

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

aiVector3D __thiscall comparer_context::cmp<aiVector3t<float>>(comparer_context *this,string *name)

{
  float fVar1;
  aiVector3D aVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  float local_38;
  float local_28;
  
  std::operator+(&local_58,name,".x");
  local_28 = cmp<float>(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+(&local_58,name,".y");
  local_38 = cmp<float>(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+(&local_58,name,".z");
  fVar1 = cmp<float>(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  aVar2.y = local_38;
  aVar2.x = local_28;
  aVar2.z = fVar1;
  return aVar2;
}

Assistant:

aiVector3D comparer_context :: cmp<aiVector3D >(const std::string& name)
{
    const float x = cmp<float>(name+".x");
    const float y = cmp<float>(name+".y");
    const float z = cmp<float>(name+".z");

    return aiVector3D(x,y,z);
}